

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsPendulum_dns.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int nout;
  N_Vector yref;
  N_Vector yy0;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  sunrealtype tf;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  void *cvode_mem;
  void *local_78;
  int local_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  long local_58;
  long local_50;
  sunrealtype local_48;
  undefined8 uStack_40;
  
  local_78 = (void *)0x0;
  uVar8 = 0;
  uVar2 = SUNContext_Create(0,&sunctx);
  if ((int)uVar2 < 0) {
    pcVar7 = "SUNContext_Create";
  }
  else {
    if (argc < 2) {
      local_68 = 0x88e368f1;
      uStack_64 = 0x3ee4f8b5;
      uStack_60 = 0x88e368f1;
      uStack_5c = 0x3ee4f8b5;
      tf = 30.0;
      nout = 1;
      local_6c = 1;
      bVar1 = false;
    }
    else {
      local_68 = 0x88e368f1;
      uStack_64 = 0x3ee4f8b5;
      uStack_60 = 0x88e368f1;
      uStack_5c = 0x3ee4f8b5;
      tf = 30.0;
      nout = 1;
      local_6c = 1;
      iVar9 = 1;
      do {
        pcVar7 = argv[iVar9];
        iVar3 = strcmp(pcVar7,"--tol");
        if (iVar3 == 0) {
          dVar10 = atof(argv[(long)iVar9 + 1]);
          local_68 = SUB84(dVar10,0);
          uStack_64 = (undefined4)((ulong)dVar10 >> 0x20);
          uStack_60 = (undefined4)extraout_XMM0_Qb;
          uStack_5c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
          dVar10 = atof(argv[(long)iVar9 + 2]);
          uStack_5c = uStack_64;
          uStack_60 = local_68;
          local_68 = SUB84(dVar10,0);
          uStack_64 = (undefined4)((ulong)dVar10 >> 0x20);
          iVar9 = iVar9 + 3;
        }
        else {
          iVar3 = strcmp(pcVar7,"--tf");
          if (iVar3 == 0) {
            tf = atof(argv[(long)iVar9 + 1]);
            iVar9 = iVar9 + 2;
          }
          else {
            iVar3 = strcmp(pcVar7,"--nout");
            if (iVar3 == 0) {
              nout = atoi(argv[(long)iVar9 + 1]);
              iVar9 = iVar9 + 2;
            }
            else {
              iVar3 = strcmp(pcVar7,"--noerrproj");
              if (iVar3 != 0) {
                iVar9 = strcmp(pcVar7,"--help");
                if (iVar9 != 0) {
                  fprintf(_stderr,"ERROR: Invalid input %s",pcVar7);
                }
                InputHelp();
                uVar8 = 0xffffffff;
                bVar1 = true;
                goto LAB_00102629;
              }
              local_6c = 0;
              iVar9 = iVar9 + 1;
            }
          }
        }
      } while (iVar9 < argc);
      bVar1 = false;
      uVar8 = 0;
    }
LAB_00102629:
    if (bVar1) {
      pcVar7 = "ReadInputs";
      goto LAB_001029bf;
    }
    yref = (N_Vector)N_VNew_Serial(4,sunctx);
    uVar2 = RefSol(tf,yref,nout);
    if ((int)uVar2 < 0) {
      pcVar7 = "RefSol";
    }
    else {
      yy0 = (N_Vector)N_VNew_Serial(4,sunctx);
      if (yy0 == (N_Vector)0x0) {
        main_cold_4();
        return 1;
      }
      puVar4 = (undefined8 *)N_VGetArrayPointer(yy0);
      *puVar4 = 0x3ff0000000000000;
      puVar4[1] = 0;
      puVar4[2] = 0;
      puVar4[3] = 0;
      local_78 = (void *)CVodeCreate(2,sunctx);
      if (local_78 == (void *)0x0) {
        main_cold_3();
        return 1;
      }
      uVar2 = CVodeInit(0,local_78,f,yy0);
      if ((int)uVar2 < 0) {
        pcVar7 = "CVodeInit";
      }
      else {
        lVar5 = SUNDenseMatrix(4,4,sunctx);
        if (lVar5 == 0) {
          main_cold_2();
          return 1;
        }
        lVar6 = SUNLinSol_Dense(yy0,lVar5,sunctx);
        if (lVar6 == 0) {
          main_cold_1();
          return 1;
        }
        uVar2 = CVodeSetLinearSolver(local_78,lVar6,lVar5);
        if ((int)uVar2 < 0) {
          pcVar7 = "CVodeSetLinearSolver";
        }
        else {
          uVar2 = CVodeSetProjFn(local_78,proj);
          if ((int)uVar2 < 0) {
            pcVar7 = "CVodeSetProjFn";
          }
          else {
            uVar2 = CVodeSetMaxNumSteps(local_78,50000);
            if ((int)uVar2 < 0) {
              pcVar7 = "CVodeSetMaxNumSteps";
            }
            else {
              iVar9 = 5;
              uVar12 = local_68;
              uVar13 = uStack_64;
              uVar14 = uStack_60;
              uVar15 = uStack_5c;
              local_58 = lVar6;
              local_50 = lVar5;
              while( true ) {
                local_48 = (sunrealtype)CONCAT44(uVar15,uVar14);
                uStack_40 = CONCAT44(uVar15,uVar14);
                local_68 = uVar12;
                uStack_64 = uVar13;
                uStack_60 = uVar14;
                uStack_5c = uVar15;
                printf("\n\nrtol = %8.2e, atol = %8.2e\n");
                printf("Project    x         y");
                printf("         x\'        y\'     |     g      |    ");
                puts("nst     rhs eval    setups (J eval)  |   cf   ef");
                uVar2 = GetSol(local_78,yy0,local_48,(sunrealtype)CONCAT44(uStack_64,local_68),tf,
                               nout,1,local_6c,yref);
                if (((int)uVar2 < 0) ||
                   (uVar2 = GetSol(local_78,yy0,local_48,(sunrealtype)CONCAT44(uStack_64,local_68),
                                   tf,nout,0,0,yref), (int)uVar2 < 0)) break;
                auVar11._4_4_ = uStack_64;
                auVar11._0_4_ = local_68;
                auVar11._8_4_ = uStack_60;
                auVar11._12_4_ = uStack_5c;
                auVar11 = divpd(auVar11,_DAT_00104020);
                iVar9 = iVar9 + -1;
                uVar12 = auVar11._0_4_;
                uVar13 = auVar11._4_4_;
                uVar14 = auVar11._8_4_;
                uVar15 = auVar11._12_4_;
                if (iVar9 == 0) {
                  N_VDestroy_Serial(yref);
                  N_VDestroy_Serial(yy0);
                  SUNMatDestroy(local_50);
                  SUNLinSolFree(local_58);
                  CVodeFree(&local_78);
                  SUNContext_Free(&sunctx);
                  return 0;
                }
              }
              pcVar7 = "GetSol";
            }
          }
        }
      }
    }
  }
  uVar8 = (ulong)uVar2;
LAB_001029bf:
  fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",pcVar7,uVar8);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  int i;
  int retval;                                  /* reusable return flag    */
  int nout               = 1;                  /* number of outputs       */
  sunrealtype rtol       = SUN_RCONST(1.0e-5); /* base relative tolerance */
  sunrealtype atol       = SUN_RCONST(1.0e-5); /* base absolute tolerance */
  sunrealtype tf         = SUN_RCONST(30.0);   /* final integration time  */
  sunbooleantype projerr = SUNTRUE;            /* enable error projection */

  void* cvode_mem      = NULL; /* CVODES memory             */
  N_Vector yy0         = NULL; /* initial condition vector  */
  sunrealtype* yy0data = NULL; /* vector data               */
  N_Vector yref        = NULL; /* reference solution vector */
  SUNMatrix A          = NULL; /* Jacobian matrix           */
  SUNLinearSolver LS   = NULL; /* linear solver             */

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Read command line inputs */
  retval = ReadInputs(&argc, &argv, &rtol, &atol, &tf, &nout, &projerr);
  if (check_retval(&retval, "ReadInputs", 1)) { return (1); }

  /* Compute reference solution */
  yref = N_VNew_Serial(4, sunctx);

  retval = RefSol(tf, yref, nout);
  if (check_retval(&retval, "RefSol", 1)) { return (1); }

  /* Create serial vector to store the initial condition */
  yy0 = N_VNew_Serial(4, sunctx);
  if (check_retval((void*)yy0, "N_VNew_Serial", 0)) { return (1); }

  /* Set the initial condition values */
  yy0data = N_VGetArrayPointer(yy0);

  yy0data[0] = ONE;  /* x  */
  yy0data[1] = ZERO; /* y  */
  yy0data[2] = ZERO; /* xd */
  yy0data[3] = ZERO; /* yd */

  /* Create CVODES memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODES */
  retval = CVodeInit(cvode_mem, f, ZERO, yy0);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(4, 4, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy0, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODES */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set a user-supplied projection function */
  retval = CVodeSetProjFn(cvode_mem, proj);
  if (check_retval(&retval, "CVodeSetProjFn", 1)) { return (1); }

  /* Set maximum number of steps between outputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 50000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Compute the solution with various tolerances */
  for (i = 0; i < 5; i++)
  {
    /* Output tolerance and output header for this run */
    printf("\n\nrtol = %8.2" ESYM ", atol = %8.2" ESYM "\n", rtol, atol);
    printf("Project    x         y");
    printf("         x'        y'     |     g      |    ");
    printf("nst     rhs eval    setups (J eval)  |   cf   ef\n");

    /* Compute solution with projection */
    retval = GetSol(cvode_mem, yy0, rtol, atol, tf, nout, SUNTRUE, projerr, yref);
    if (check_retval(&retval, "GetSol", 1)) { return (1); }

    /* Compute solution without projection */
    retval = GetSol(cvode_mem, yy0, rtol, atol, tf, nout, SUNFALSE, SUNFALSE,
                    yref);
    if (check_retval(&retval, "GetSol", 1)) { return (1); }

    /* Reduce tolerance for next run */
    rtol /= SUN_RCONST(10.0);
    atol /= SUN_RCONST(10.0);
  }

  /* Free memory */
  N_VDestroy_Serial(yref);
  N_VDestroy_Serial(yy0);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}